

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinDeserializer<std::deque<char,_std::allocator<char>_>,_void>::
     deserialize_elems_noinsert<InputStream>(long param_1,undefined8 param_2,InputStream *param_3)

{
  char *pcVar1;
  char *pcVar2;
  char *elem;
  char *t;
  long lVar3;
  
  t = *(char **)(param_1 + 0x10);
  pcVar2 = *(char **)(param_1 + 0x20);
  lVar3 = *(long *)(param_1 + 0x28);
  pcVar1 = *(char **)(param_1 + 0x30);
  while (t != pcVar1) {
    TrivialDeserializer<char>::deserialize<InputStream>(t,param_3);
    t = t + 1;
    if (t == pcVar2) {
      t = *(char **)(lVar3 + 8);
      lVar3 = lVar3 + 8;
      pcVar2 = t + 0x200;
    }
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }